

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

void __thiscall re2::Tester::Tester(Tester *this,StringPiece *regexp)

{
  bool bVar1;
  TestInstance *this_00;
  TestInstance *local_28;
  TestInstance *t;
  int j;
  int i;
  StringPiece *regexp_local;
  Tester *this_local;
  
  _j = regexp;
  regexp_local = (StringPiece *)this;
  std::vector<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::vector(&this->v_);
  this->error_ = false;
  for (t._4_4_ = 0; t._4_4_ < 3; t._4_4_ = t._4_4_ + 1) {
    for (t._0_4_ = 0; (int)t < 5; t._0_4_ = (int)t + 1) {
      this_00 = (TestInstance *)operator_new(0x48);
      TestInstance::TestInstance
                (this_00,_j,*(MatchKind *)(kinds + (long)t._4_4_ * 4),
                 *(ParseFlags *)(parse_modes + (long)(int)t * 0x28));
      local_28 = this_00;
      bVar1 = TestInstance::error(this_00);
      this->error_ = (bool)(this->error_ & 1U | bVar1);
      std::vector<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>::push_back
                (&this->v_,&local_28);
    }
  }
  return;
}

Assistant:

Tester::Tester(const StringPiece& regexp) {
  error_ = false;
  for (int i = 0; i < arraysize(kinds); i++) {
    for (int j = 0; j < arraysize(parse_modes); j++) {
      TestInstance* t = new TestInstance(regexp, kinds[i],
                                         parse_modes[j].parse_flags);
      error_ |= t->error();
      v_.push_back(t);
    }
  }
}